

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SkeletonReader::~SkeletonReader(SkeletonReader *this)

{
  ostream *poVar1;
  SkeletonReader *in_RDI;
  Engine *in_stack_ffffffffffffffd0;
  
  (in_RDI->super_Engine)._vptr_Engine = (_func_int **)&PTR__SkeletonReader_01130388;
  if (in_RDI->m_Verbosity == 5) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Skeleton Reader ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->m_ReaderRank);
    poVar1 = std::operator<<(poVar1," deconstructor on ");
    in_stack_ffffffffffffffd0 =
         (Engine *)std::operator<<(poVar1,(string *)&(in_RDI->super_Engine).m_Name);
    std::operator<<((ostream *)in_stack_ffffffffffffffd0,"\n");
  }
  if (((in_RDI->super_Engine).m_IsOpen & 1U) != 0) {
    DestructorClose(in_RDI,(bool)((in_RDI->super_Engine).m_FailVerbose & 1));
  }
  (in_RDI->super_Engine).m_IsOpen = false;
  Engine::~Engine(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

SkeletonReader::~SkeletonReader()
{
    /* m_Skeleton deconstructor does close and finalize */
    if (m_Verbosity == 5)
    {
        std::cout << "Skeleton Reader " << m_ReaderRank << " deconstructor on " << m_Name << "\n";
    }
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}